

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O0

_Bool project_f(source origin,wchar_t r,loc_conflict grid,wchar_t dam,wchar_t typ)

{
  project_feature_handler_f feature_handler;
  project_feature_handler_context_t context;
  _Bool obvious;
  wchar_t typ_local;
  wchar_t dam_local;
  wchar_t r_local;
  loc_conflict grid_local;
  source origin_local;
  
  context.origin._0_8_ = origin.which;
  context.type._3_1_ = 0;
  feature_handler = (project_feature_handler_f)CONCAT44(grid_local.y,origin.what);
  context.dam._0_1_ = 0;
  if (feature_handlers[typ] != (project_feature_handler_f)0x0) {
    context.origin.which.monster = r;
    context._12_8_ = grid;
    context.grid.x = dam;
    context.grid.y = typ;
    context._36_4_ = typ;
    (*feature_handlers[typ])((project_feature_handler_context_t *)&feature_handler);
  }
  return (_Bool)((byte)context.dam & 1);
}

Assistant:

bool project_f(struct source origin, int r, struct loc grid, int dam, int typ)
{
	bool obvious = false;

	project_feature_handler_context_t context = {
		origin,
		r,
		grid,
		dam,
		typ,
		obvious,
	};
	project_feature_handler_f feature_handler = feature_handlers[typ];

	if (feature_handler != NULL)
		feature_handler(&context);

	/* Return "Anything seen?" */
	return context.obvious;
}